

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::IEEEFloat::initFromAPInt(IEEEFloat *this,fltSemantics *Sem,APInt *api)

{
  if (Sem == (fltSemantics *)semIEEEhalf) {
    initFromHalfAPInt(this,api);
    return;
  }
  if (Sem == (fltSemantics *)semIEEEsingle) {
    initFromFloatAPInt(this,api);
    return;
  }
  if (Sem == (fltSemantics *)semIEEEdouble) {
    initFromDoubleAPInt(this,api);
    return;
  }
  if (Sem != (fltSemantics *)semX87DoubleExtended) {
    if (Sem == (fltSemantics *)semIEEEquad) {
      initFromQuadrupleAPInt(this,api);
      return;
    }
    if (Sem == (fltSemantics *)semPPCDoubleDoubleLegacy) {
      initFromPPCDoubleDoubleAPInt(this,api);
      return;
    }
    llvm_unreachable_internal
              ((char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0xcaf);
  }
  initFromF80LongDoubleAPInt(this,api);
  return;
}

Assistant:

void IEEEFloat::initFromAPInt(const fltSemantics *Sem, const APInt &api) {
  if (Sem == &semIEEEhalf)
    return initFromHalfAPInt(api);
  if (Sem == &semIEEEsingle)
    return initFromFloatAPInt(api);
  if (Sem == &semIEEEdouble)
    return initFromDoubleAPInt(api);
  if (Sem == &semX87DoubleExtended)
    return initFromF80LongDoubleAPInt(api);
  if (Sem == &semIEEEquad)
    return initFromQuadrupleAPInt(api);
  if (Sem == &semPPCDoubleDoubleLegacy)
    return initFromPPCDoubleDoubleAPInt(api);

  llvm_unreachable(nullptr);
}